

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

string * __thiscall
hexpattern::guidregex_abi_cxx11_(string *__return_storage_ptr__,hexpattern *this)

{
  ByteMaskType local_48;
  hexpattern *local_18;
  hexpattern *this_local;
  
  local_18 = this;
  this_local = (hexpattern *)__return_storage_ptr__;
  getguidmask(&local_48,this);
  datamask2regex_abi_cxx11_(__return_storage_ptr__,this,&local_48);
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~pair(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string guidregex()
    {
        return datamask2regex(getguidmask());
    }